

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

int __thiscall KryoFlux::GetInfo(KryoFlux *this,int index,string *info)

{
  int iVar1;
  string asStack_38 [32];
  
  (**(code **)(*(long *)this + 0x18))(asStack_38,this,0x81,index,0);
  std::__cxx11::string::operator=((string *)info,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  iVar1 = ResponseCode(info);
  std::__cxx11::string::find((char)info,0x20);
  std::__cxx11::string::erase((ulong)info,0);
  std::__cxx11::string::find((char)info,0x20);
  std::__cxx11::string::erase((ulong)info,0);
  return iVar1;
}

Assistant:

int KryoFlux::GetInfo(int index, std::string& info)
{
    info = Control(REQ_INFO | REQ_GET, index);
    auto ret = ResponseCode(info);
    info.erase(0, info.find(' ') + 1);  // remove time code
    info.erase(0, info.find(' ') + 1);  // remove info response
    return ret;
}